

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O1

Value __thiscall
flexbuffers::Builder::CreateVector
          (Builder *this,size_t start,size_t vec_len,size_t step,bool typed,bool fixed,Value *keys)

{
  iterator __position;
  BitWidth BVar1;
  pointer pVVar2;
  unsigned_long uVar3;
  BitWidth BVar4;
  BitWidth BVar5;
  int iVar6;
  undefined3 in_register_00000081;
  undefined3 in_register_00000089;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  size_t i;
  long lVar10;
  size_t sVar11;
  Value VVar12;
  byte local_79;
  ulong local_78;
  undefined4 local_6c;
  pointer local_68;
  value_type_conflict1 local_59;
  pointer local_58;
  undefined8 local_50;
  undefined4 local_44;
  size_t local_40;
  size_t local_38;
  
  local_44 = CONCAT31(in_register_00000089,fixed);
  local_6c = CONCAT31(in_register_00000081,typed);
  if (fixed && !typed) {
    __assert_fail("!fixed || typed",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                  ,0x64a,
                  "Value flexbuffers::Builder::CreateVector(size_t, size_t, size_t, bool, bool, const Value *)"
                 );
  }
  BVar5 = BIT_WIDTH_8;
  if ((0xff < vec_len) && (BVar5 = BIT_WIDTH_16, 0xffff < vec_len)) {
    BVar5 = BIT_WIDTH_64 - (vec_len >> 0x20 == 0);
  }
  if ((int)BVar5 < (int)this->force_min_bit_width_) {
    BVar5 = this->force_min_bit_width_;
  }
  local_38 = vec_len;
  if (keys == (Value *)0x0) {
    local_50 = 1;
  }
  else {
    BVar1 = Value::ElemWidth(keys,(long)(this->buf_).
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->buf_).
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start,0);
    if ((int)BVar1 < (int)BVar5) {
      BVar1 = BVar5;
    }
    local_50 = 3;
    BVar5 = BVar1;
  }
  pVVar2 = (this->stack_).
           super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_78 = 4;
  local_40 = start;
  if (start < (ulong)((long)(this->stack_).
                            super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 4)) {
    lVar9 = start << 4;
    local_68 = (pointer)(step << 4);
    local_78 = 4;
    lVar10 = 0;
    do {
      BVar1 = Value::ElemWidth((Value *)((long)&pVVar2->field_0 + lVar9),
                               (long)(this->buf_).
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->buf_).
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,local_50 + lVar10);
      if ((int)BVar1 < (int)BVar5) {
        BVar1 = BVar5;
      }
      BVar5 = BVar1;
      uVar8 = local_78;
      if ((char)local_6c != '\0') {
        uVar7 = *(uint *)((long)&((this->stack_).
                                  super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->type_ + lVar9);
        uVar8 = (ulong)uVar7;
        if ((lVar10 != 0) && (uVar8 = local_78, (uint)local_78 != uVar7)) {
          __assert_fail("vector_type == stack_[i].type_",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                        ,0x660,
                        "Value flexbuffers::Builder::CreateVector(size_t, size_t, size_t, bool, bool, const Value *)"
                       );
        }
      }
      local_78 = uVar8;
      pVVar2 = (this->stack_).
               super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar10 = lVar10 + step;
      lVar9 = lVar9 + (long)local_68;
    } while (local_40 + lVar10 <
             (ulong)((long)(this->stack_).
                           super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 4));
  }
  if ((((char)local_6c != '\0') && (4 < (int)local_78 - 1U)) && ((int)local_78 != 0x1a)) {
    __assert_fail("!typed || IsTypedVectorElementType(vector_type)",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                  ,0x666,
                  "Value flexbuffers::Builder::CreateVector(size_t, size_t, size_t, bool, bool, const Value *)"
                 );
  }
  uVar7 = 1 << ((byte)BVar5 & 0x1f);
  __position._M_current =
       (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_59 = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_insert
            (&this->buf_,__position,
             (ulong)uVar7 - 1 &
             (long)(this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start - (long)__position._M_current,&local_59)
  ;
  sVar11 = local_40;
  local_50 = CONCAT44(local_50._4_4_,uVar7) & 0xffffffff000000ff;
  if (keys != (Value *)0x0) {
    WriteOffset(this,(keys->field_0).u_,(uint8_t)local_50);
    Write<unsigned_long>(this,1L << ((char)keys->min_bit_width_ & 0x3f),(ulong)(uVar7 & 0xff));
  }
  if ((char)local_44 == '\0') {
    Write<unsigned_long>(this,local_38,(ulong)uVar7 & 0xff);
  }
  local_58 = (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_68 = (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
  pVVar2 = (this->stack_).
           super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (sVar11 < (ulong)((long)(this->stack_).
                             super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 4)) {
    lVar9 = local_40 << 4;
    sVar11 = local_40;
    do {
      WriteAny(this,(Value *)((long)&pVVar2->field_0 + lVar9),(uint8_t)local_50);
      sVar11 = sVar11 + step;
      pVVar2 = (this->stack_).
               super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar9 = lVar9 + step * 0x10;
    } while (sVar11 < (ulong)((long)(this->stack_).
                                    super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 4))
    ;
  }
  if (((char)local_6c == '\0') &&
     (pVVar2 = (this->stack_).
               super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
               ._M_impl.super__Vector_impl_data._M_start,
     local_40 <
     (ulong)((long)(this->stack_).
                   super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 4))) {
    uVar8 = local_40 << 4 | 0xc;
    sVar11 = local_40;
    do {
      BVar1 = *(BitWidth *)((long)&pVVar2->field_0 + uVar8);
      BVar4 = BVar5;
      if ((int)BVar5 < (int)BVar1) {
        BVar4 = BVar1;
      }
      iVar6 = *(int *)((long)pVVar2 + (uVar8 - 4));
      if (iVar6 == 0x1a) {
        BVar1 = BVar4;
      }
      local_79 = (byte)BVar1;
      if (iVar6 < 4) {
        local_79 = (byte)BVar4;
      }
      local_79 = (byte)(iVar6 << 2) | local_79;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&this->buf_,&local_79);
      sVar11 = sVar11 + step;
      pVVar2 = (this->stack_).
               super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = uVar8 + step * 0x10;
    } while (sVar11 < (ulong)((long)(this->stack_).
                                    super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 4))
    ;
  }
  if (((byte)local_6c & keys == (Value *)0x0) == 1) {
    iVar6 = (int)local_78;
    if ((4 < iVar6 - 1U) && (iVar6 != 0x1a)) {
      __assert_fail("IsTypedVectorElementType(t)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                    ,0x69,"Type flexbuffers::ToTypedVector(Type, size_t)");
    }
    uVar3 = 0;
    if ((char)local_44 != '\0') {
      uVar3 = local_38;
    }
    switch(uVar3) {
    case 0:
      iVar6 = iVar6 + 10;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                    ,0x6f,"Type flexbuffers::ToTypedVector(Type, size_t)");
    case 2:
      iVar6 = iVar6 + 0xf;
      break;
    case 3:
      iVar6 = iVar6 + 0x12;
      break;
    case 4:
      iVar6 = iVar6 + 0x15;
    }
  }
  else {
    iVar6 = (keys == (Value *)0x0) + 9;
  }
  VVar12.field_0.i_ = (long)local_68 - (long)local_58;
  VVar12.min_bit_width_ = BVar5;
  VVar12.type_ = iVar6;
  return VVar12;
}

Assistant:

Value CreateVector(size_t start, size_t vec_len, size_t step, bool typed,
                     bool fixed, const Value *keys = nullptr) {
    FLATBUFFERS_ASSERT(
        !fixed ||
        typed);  // typed=false, fixed=true combination is not supported.
    // Figure out smallest bit width we can store this vector with.
    auto bit_width = (std::max)(force_min_bit_width_, WidthU(vec_len));
    auto prefix_elems = 1;
    if (keys) {
      // If this vector is part of a map, we will pre-fix an offset to the keys
      // to this vector.
      bit_width = (std::max)(bit_width, keys->ElemWidth(buf_.size(), 0));
      prefix_elems += 2;
    }
    Type vector_type = FBT_KEY;
    // Check bit widths and types for all elements.
    for (size_t i = start; i < stack_.size(); i += step) {
      auto elem_width =
          stack_[i].ElemWidth(buf_.size(), i - start + prefix_elems);
      bit_width = (std::max)(bit_width, elem_width);
      if (typed) {
        if (i == start) {
          vector_type = stack_[i].type_;
        } else {
          // If you get this assert, you are writing a typed vector with
          // elements that are not all the same type.
          FLATBUFFERS_ASSERT(vector_type == stack_[i].type_);
        }
      }
    }
    // If you get this assert, your typed types are not one of:
    // Int / UInt / Float / Key.
    FLATBUFFERS_ASSERT(!typed || IsTypedVectorElementType(vector_type));
    auto byte_width = Align(bit_width);
    // Write vector. First the keys width/offset if available, and size.
    if (keys) {
      WriteOffset(keys->u_, byte_width);
      Write<uint64_t>(1ULL << keys->min_bit_width_, byte_width);
    }
    if (!fixed) Write<uint64_t>(vec_len, byte_width);
    // Then the actual data.
    auto vloc = buf_.size();
    for (size_t i = start; i < stack_.size(); i += step) {
      WriteAny(stack_[i], byte_width);
    }
    // Then the types.
    if (!typed) {
      for (size_t i = start; i < stack_.size(); i += step) {
        buf_.push_back(stack_[i].StoredPackedType(bit_width));
      }
    }
    return Value(static_cast<uint64_t>(vloc),
                 keys ? FBT_MAP
                      : (typed ? ToTypedVector(vector_type, fixed ? vec_len : 0)
                               : FBT_VECTOR),
                 bit_width);
  }